

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O3

Expectation __thiscall
testing::internal::UntypedFunctionMockerBase::GetHandleOf
          (UntypedFunctionMockerBase *this,ExpectationBase *exp)

{
  FailureReporterInterface *pFVar1;
  element_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<testing::internal::ExpectationBase> *an_expectation_base;
  Expectation EVar3;
  long *local_30 [2];
  long local_20 [2];
  
  an_expectation_base =
       *(shared_ptr<testing::internal::ExpectationBase> **)((long)&(exp->source_text_).field_2 + 8);
  do {
    if (an_expectation_base ==
        *(shared_ptr<testing::internal::ExpectationBase> **)&exp->cardinality_specified_) {
      local_30[0] = local_20;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_30,"Cannot find expectation.","");
      pFVar1 = GetFailureReporter();
      (*pFVar1->_vptr_FailureReporterInterface[2])
                (pFVar1,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/googletest/googlemock/src/gmock-spec-builders.cc"
                 ,0x204,local_30);
      if (local_30[0] != local_20) {
        operator_delete(local_30[0],local_20[0] + 1);
      }
      Expectation::Expectation((Expectation *)this);
      _Var2._M_pi = extraout_RDX;
LAB_0010e310:
      EVar3.expectation_base_.
      super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = _Var2._M_pi;
      EVar3.expectation_base_.
      super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (Expectation)
             EVar3.expectation_base_.
             super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>;
    }
    if ((an_expectation_base->
        super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        == in_RDX) {
      Expectation::Expectation((Expectation *)this,an_expectation_base);
      _Var2._M_pi = extraout_RDX_00;
      goto LAB_0010e310;
    }
    an_expectation_base = an_expectation_base + 1;
  } while( true );
}

Assistant:

Expectation UntypedFunctionMockerBase::GetHandleOf(ExpectationBase* exp) {
  // See the definition of untyped_expectations_ for why access to it
  // is unprotected here.
  for (UntypedExpectations::const_iterator it =
           untyped_expectations_.begin();
       it != untyped_expectations_.end(); ++it) {
    if (it->get() == exp) {
      return Expectation(*it);
    }
  }

  Assert(false, __FILE__, __LINE__, "Cannot find expectation.");
  return Expectation();
  // The above statement is just to make the code compile, and will
  // never be executed.
}